

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH128_hash_t
XXH3_hashLong_128b_internal
          (void *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH3_f_accumulate_512 f_acc512,
          XXH3_f_scrambleAcc f_scramble)

{
  XXH64_hash_t XVar1;
  XXH128_hash_t XVar2;
  xxh_u64 acc [8];
  
  XXH3_hashLong_internal_loop
            ((xxh_u64 *)&stack0xffffffffffffff98,(xxh_u8 *)input,len,secret,secretSize,
             (XXH3_f_accumulate_512)f_scramble,(XXH3_f_scrambleAcc)0xc2b2ae3d);
  XVar2.low64 = XXH3_mergeAccs((xxh_u64 *)&stack0xffffffffffffff98,secret + 0xb,
                               len * -0x61c8864e7a143579);
  XVar1 = XXH3_mergeAccs((xxh_u64 *)&stack0xffffffffffffff98,secret + (secretSize - 0x4b),
                         ~(len * -0x3d4d51c2d82b14b1));
  XVar2.high64 = XVar1;
  return XVar2;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t XXH3_hashLong_128b_internal(
    const void* XXH_RESTRICT input, size_t len,
    const xxh_u8* XXH_RESTRICT secret, size_t secretSize,
    XXH3_f_accumulate_512 f_acc512, XXH3_f_scrambleAcc f_scramble) {
  XXH_ALIGN(XXH_ACC_ALIGN) xxh_u64 acc[XXH_ACC_NB] = XXH3_INIT_ACC;

  XXH3_hashLong_internal_loop(acc, (const xxh_u8*)input, len, secret,
                              secretSize, f_acc512, f_scramble);

  /* converge into final hash */
  XXH_STATIC_ASSERT(sizeof(acc) == 64);
  XXH_ASSERT(secretSize >= sizeof(acc) + XXH_SECRET_MERGEACCS_START);
  {
    XXH128_hash_t h128;
    h128.low64 = XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START,
                                (xxh_u64)len * XXH_PRIME64_1);
    h128.high64 = XXH3_mergeAccs(
        acc, secret + secretSize - sizeof(acc) - XXH_SECRET_MERGEACCS_START,
        ~((xxh_u64)len * XXH_PRIME64_2));
    return h128;
  }
}